

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

bool __thiscall minja::Value::operator<(Value *this,Value *other)

{
  bool bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  double dVar2;
  double dVar3;
  bool in_stack_00000073;
  int in_stack_00000074;
  Value *in_stack_00000078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  Value *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  Value *in_stack_ffffffffffffff20;
  Value *in_stack_ffffffffffffff38;
  string local_88 [32];
  string local_68 [32];
  string local_48 [71];
  byte local_1;
  
  bVar1 = is_null(in_stack_fffffffffffffed0);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Undefined value or reference");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_number((Value *)0x2a8f37);
  if ((bVar1) && (bVar1 = is_number((Value *)0x2a8f4a), bVar1)) {
    dVar2 = get<double>(in_stack_ffffffffffffff20);
    dVar3 = get<double>(in_stack_ffffffffffffff20);
    local_1 = dVar2 < dVar3;
  }
  else {
    bVar1 = is_string((Value *)0x2a8f92);
    if ((!bVar1) || (bVar1 = is_string((Value *)0x2a8fa8), !bVar1)) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      dump_abi_cxx11_(in_stack_00000078,in_stack_00000074,in_stack_00000073);
      std::operator+((char *)in_stack_fffffffffffffed8,__rhs);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
      dump_abi_cxx11_(in_stack_00000078,in_stack_00000074,in_stack_00000073);
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::runtime_error::runtime_error((runtime_error *)__rhs,local_88);
      __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get<std::__cxx11::string>(in_stack_ffffffffffffff38);
    get<std::__cxx11::string>(in_stack_ffffffffffffff38);
    local_1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool operator<(const Value & other) const {
    if (is_null())
      throw std::runtime_error("Undefined value or reference");
    if (is_number() && other.is_number()) return get<double>() < other.get<double>();
    if (is_string() && other.is_string()) return get<std::string>() < other.get<std::string>();
    throw std::runtime_error("Cannot compare values: " + dump() + " < " + other.dump());
  }